

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O1

void __thiscall singleParticleSpectra::output_spectra_and_Qn_results(singleParticleSpectra *this)

{
  output_Qn_vectors(this);
  if (this->rapidity_distribution_flag == 1) {
    output_rapidity_distribution(this);
    if (this->rapidityPTDistributionFlag_ == 1) {
      outputRapidityPTDistribution(this);
    }
    if (this->flag_correlation == 1) {
      output_two_particle_correlation_rap(this);
      output_three_particle_correlation_rap(this);
    }
  }
  if (this->check_spatial_flag == 1) {
    output_dNdSV(this);
  }
  if (this->flag_correlation == 1) {
    output_two_particle_correlation(this);
    output_three_particle_correlation(this);
    output_four_particle_Cn4_correlation(this);
    output_four_particle_SC_correlation(this);
    return;
  }
  return;
}

Assistant:

void singleParticleSpectra::output_spectra_and_Qn_results() {
    output_Qn_vectors();
    if (rapidity_distribution_flag == 1) {
        output_rapidity_distribution();

        if (rapidityPTDistributionFlag_ == 1) {
            outputRapidityPTDistribution();
        }

        if (flag_correlation == 1) {
            output_two_particle_correlation_rap();
            output_three_particle_correlation_rap();
        }
    }
    if (check_spatial_flag == 1) output_dNdSV();
    if (flag_correlation == 1) {
        output_two_particle_correlation();
        output_three_particle_correlation();
        output_four_particle_Cn4_correlation();
        output_four_particle_SC_correlation();
    }
}